

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O0

ion_status_t oafh_delete(ion_file_hashmap_t *hash_map,ion_key_t key)

{
  ion_status_t iVar1;
  ion_err_t iVar2;
  int iVar3;
  int iVar4;
  undefined1 *__ptr;
  int record_size;
  ion_hash_bucket_t *item;
  ion_key_t pvStack_20;
  int loc;
  ion_key_t key_local;
  ion_file_hashmap_t *hash_map_local;
  
  pvStack_20 = key;
  key_local = hash_map;
  iVar2 = oafh_find_item_loc(hash_map,key,(int *)((long)&item + 4));
  if (iVar2 != '\x01') {
    iVar3 = *(int *)((long)key_local + 4) + *(int *)((long)key_local + 8);
    iVar4 = iVar3 + 1;
    __ptr = (undefined1 *)malloc((long)iVar4);
    fseek(*(FILE **)((long)key_local + 0x30),(long)(item._4_4_ * iVar4),0);
    fread(__ptr,1,1,*(FILE **)((long)key_local + 0x30));
    fread(__ptr + 1,(long)iVar3,1,*(FILE **)((long)key_local + 0x30));
    *__ptr = 0xfe;
    fseek(*(FILE **)((long)key_local + 0x30),(long)-iVar4,1);
    fwrite(__ptr,1,1,*(FILE **)((long)key_local + 0x30));
    fwrite(__ptr + 1,(long)iVar3,1,*(FILE **)((long)key_local + 0x30));
    free(__ptr);
    hash_map_local._0_4_ = (uint)hash_map_local & 0xffffff00;
  }
  else {
    hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,1);
  }
  iVar1.count._0_1_ = iVar2 != '\x01';
  iVar1._0_4_ = (uint)hash_map_local;
  iVar1.count._1_3_ = 0;
  return iVar1;
}

Assistant:

ion_status_t
oafh_delete(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key
) {
	int loc;

	if (oafh_find_item_loc(hash_map, key, &loc) == err_item_not_found) {
#if ION_DEBUG
		printf("Item not found when trying to oah_delete.\n");
#endif
		return ION_STATUS_ERROR(err_item_not_found);
	}
	else {
		/* locate item */
		ion_hash_bucket_t *item;

		int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

		item = malloc(record_size);

		/* set file position */
		fseek(hash_map->file, loc * record_size, SEEK_SET);

		fread(&item->status, SIZEOF(STATUS), 1, hash_map->file);
		fread(item->data, record_size - SIZEOF(STATUS), 1, hash_map->file);

		item->status = ION_DELETED;	/* delete item */

		/* backup */
		fseek(hash_map->file, -record_size, SEEK_CUR);
		fwrite(&item->status, SIZEOF(STATUS), 1, hash_map->file);
		fwrite(item->data, record_size - SIZEOF(STATUS), 1, hash_map->file);

		free(item);
#if ION_DEBUG
		printf("Item deleted at location %d\n", loc);
#endif
		return ION_STATUS_OK(1);
	}
}